

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  uint uVar1;
  long lVar2;
  stbtt_uint16 sVar3;
  stbtt_uint16 sVar4;
  stbtt_int16 sVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  stbtt_uint32 sVar9;
  stbtt_uint32 sVar10;
  stbtt_uint32 sVar11;
  uint in_ESI;
  long in_RDI;
  stbtt_uint32 start_glyph;
  stbtt_uint32 end_char;
  stbtt_uint32 start_char;
  stbtt_int32 mid;
  stbtt_int32 high;
  stbtt_int32 low;
  stbtt_uint32 ngroups;
  stbtt_uint16 item;
  stbtt_uint16 start;
  stbtt_uint16 offset;
  stbtt_uint16 end;
  stbtt_uint32 search;
  stbtt_uint32 endCount;
  stbtt_uint16 rangeShift;
  stbtt_uint16 entrySelector;
  stbtt_uint16 searchRange;
  stbtt_uint16 segcount;
  stbtt_uint32 count;
  stbtt_uint32 first;
  stbtt_int32 bytes;
  stbtt_uint16 format;
  stbtt_uint32 index_map;
  stbtt_uint8 *data;
  stbtt_uint32 local_58;
  int local_54;
  uint local_44;
  stbtt_uint16 local_3a;
  ushort local_38;
  uint local_4;
  
  lVar2 = *(long *)(in_RDI + 8);
  uVar1 = *(uint *)(in_RDI + 0x34);
  sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1));
  if (sVar3 == 0) {
    sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 2));
    if ((int)in_ESI < (int)(sVar3 - 6)) {
      local_4 = (uint)*(byte *)(lVar2 + (ulong)uVar1 + 6 + (long)(int)in_ESI);
    }
    else {
      local_4 = 0;
    }
  }
  else if (sVar3 == 6) {
    sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 6));
    uVar7 = (uint)sVar3;
    sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 8));
    if ((in_ESI < uVar7) || (uVar7 + sVar3 <= in_ESI)) {
      local_4 = 0;
    }
    else {
      sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 10 + (ulong)((in_ESI - uVar7) * 2)));
      local_4 = (uint)sVar3;
    }
  }
  else if (sVar3 == 2) {
    local_4 = 0;
  }
  else if (sVar3 == 4) {
    sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 6));
    iVar6 = (int)(uint)sVar3 >> 1;
    sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 8));
    local_38 = (ushort)((int)(uint)sVar3 >> 1);
    local_3a = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 10));
    sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 0xc));
    uVar7 = uVar1 + 0xe;
    if ((int)in_ESI < 0x10000) {
      sVar4 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)uVar7 + (long)(((int)(uint)sVar3 >> 1) << 1)))
      ;
      local_44 = uVar7;
      if ((int)(uint)sVar4 <= (int)in_ESI) {
        local_44 = ((int)(uint)sVar3 >> 1) * 2 + uVar7;
      }
      local_44 = local_44 - 2;
      for (; local_3a != 0; local_3a = local_3a - 1) {
        iVar8 = (int)(uint)local_38 >> 1;
        local_38 = (ushort)iVar8;
        sVar3 = ttUSHORT((stbtt_uint8 *)(lVar2 + (ulong)local_44 + (long)(iVar8 << 1)));
        if ((int)(uint)sVar3 < (int)in_ESI) {
          local_44 = iVar8 * 2 + local_44;
        }
      }
      uVar7 = (local_44 + 2) - uVar7 >> 1;
      sVar3 = ttUSHORT((stbtt_uint8 *)
                       (lVar2 + (ulong)uVar1 + (long)(iVar6 << 1) + 0x10 +
                       (long)(int)((uVar7 & 0xffff) << 1)));
      if ((int)in_ESI < (int)(uint)sVar3) {
        local_4 = 0;
      }
      else {
        sVar4 = ttUSHORT((stbtt_uint8 *)
                         (lVar2 + (ulong)uVar1 + (long)(iVar6 * 6) + 0x10 +
                         (long)(int)((uVar7 & 0xffff) << 1)));
        if (sVar4 == 0) {
          sVar5 = ttSHORT((stbtt_uint8 *)
                          (lVar2 + (ulong)uVar1 + (long)(iVar6 << 2) + 0x10 +
                          (long)(int)((uVar7 & 0xffff) << 1)));
          local_4 = in_ESI + (int)sVar5 & 0xffff;
        }
        else {
          sVar3 = ttUSHORT((stbtt_uint8 *)
                           (lVar2 + (int)(uint)sVar4 + (long)(int)((in_ESI - sVar3) * 2) +
                            (ulong)uVar1 + (long)(iVar6 * 6) + 0x10 +
                           (long)(int)((uVar7 & 0xffff) << 1)));
          local_4 = (uint)sVar3;
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  else if ((sVar3 == 0xc) || (sVar3 == 0xd)) {
    sVar9 = ttULONG((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 0xc));
    local_54 = 0;
    while (local_58 = sVar9, local_54 < (int)local_58) {
      sVar9 = local_54 + ((int)(local_58 - local_54) >> 1);
      sVar10 = ttULONG((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + 0x10 + (long)(int)(sVar9 * 0xc)));
      sVar11 = ttULONG((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + (long)(int)(sVar9 * 0xc) + 0x14));
      if (sVar10 <= in_ESI) {
        if (in_ESI <= sVar11) {
          sVar9 = ttULONG((stbtt_uint8 *)(lVar2 + (ulong)uVar1 + (long)(int)(sVar9 * 0xc) + 0x18));
          if (sVar3 != 0xc) {
            return sVar9;
          }
          return (sVar9 + in_ESI) - sVar10;
        }
        local_54 = sVar9 + 1;
        sVar9 = local_58;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         STBTT_assert(unicode_codepoint <= ttUSHORT(data + endCount + 2*item));
         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}